

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_2,_4> *
tcu::operator*(Matrix<float,_2,_4> *__return_storage_ptr__,Matrix<float,_2,_3> *a,
              Matrix<float,_3,_4> *b)

{
  long lVar1;
  Matrix<float,_2,_4> *res;
  float *pfVar2;
  int col;
  long lVar3;
  Vector<float,_3> *pVVar4;
  int ndx;
  long lVar5;
  bool bVar6;
  float v;
  float fVar7;
  
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[3].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  lVar1 = 0;
  pfVar2 = (float *)__return_storage_ptr__;
  do {
    lVar3 = 0;
    do {
      fVar7 = 1.0;
      if (lVar1 != lVar3) {
        fVar7 = 0.0;
      }
      pfVar2[lVar3 * 2] = fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    pfVar2 = pfVar2 + 1;
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  lVar1 = 0;
  do {
    lVar3 = 0;
    pVVar4 = (Vector<float,_3> *)b;
    do {
      fVar7 = 0.0;
      lVar5 = 0;
      do {
        fVar7 = fVar7 + *(float *)((long)a + lVar5 * 2 * 4) *
                        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar4->m_data)->m_data[0].m_data
                        [lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      (__return_storage_ptr__->m_data).m_data[lVar3].m_data[lVar1] = fVar7;
      lVar3 = lVar3 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar3 != 4);
    a = (Matrix<float,_2,_3> *)((long)a + 4);
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}